

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

NodeOutputData *
dxil_spv::Converter::Impl::get_node_output(NodeOutputData *__return_storage_ptr__,MDNode *output)

{
  uint uVar1;
  MDOperand *md;
  ulong in_RCX;
  String local_50;
  MDNode *local_30;
  MDNode *output_node;
  NodeMetadataTag tag;
  uint32_t i;
  uint32_t num_ops;
  MDNode *output_local;
  NodeOutputData *data;
  
  i._3_1_ = 0;
  _num_ops = output;
  output_local = (MDNode *)__return_storage_ptr__;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string(&__return_storage_ptr__->node_id);
  __return_storage_ptr__->node_array_index = 0;
  __return_storage_ptr__->node_array_size = 0;
  __return_storage_ptr__->node_index_spec_constant_id = 0;
  __return_storage_ptr__->max_records = 0;
  __return_storage_ptr__->sparse_array = false;
  tag = LLVMBC::MDNode::getNumOperands(_num_ops);
  for (output_node._4_4_ = NodeOutputID; output_node._4_4_ < tag;
      output_node._4_4_ = output_node._4_4_ + NodeRecordType) {
    output_node._0_4_ = get_constant_metadata<unsigned_int>(_num_ops,output_node._4_4_);
    uVar1 = (uint)in_RCX;
    if ((uint)output_node == 0) {
      md = LLVMBC::MDNode::getOperand(_num_ops,output_node._4_4_ + NodeIOFlags);
      local_30 = LLVMBC::cast<LLVMBC::MDNode>(md);
      get_string_metadata_abi_cxx11_(&local_50,(dxil_spv *)local_30,(MDNode *)0x0,uVar1);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator=
                (&__return_storage_ptr__->node_id,&local_50);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
      ~basic_string(&local_50);
      uVar1 = get_constant_metadata<unsigned_int>(local_30,1);
      in_RCX = (ulong)uVar1;
      __return_storage_ptr__->node_array_index = uVar1;
    }
    else if ((uint)output_node == 6) {
      uVar1 = get_constant_metadata<unsigned_int>(_num_ops,output_node._4_4_ + NodeIOFlags);
      in_RCX = (ulong)CONCAT31((int3)(uVar1 >> 8),uVar1 != 0);
      __return_storage_ptr__->sparse_array = uVar1 != 0;
    }
    else if ((uint)output_node == 5) {
      uVar1 = get_constant_metadata<unsigned_int>(_num_ops,output_node._4_4_ + NodeIOFlags);
      in_RCX = (ulong)uVar1;
      __return_storage_ptr__->node_array_size = uVar1;
    }
    else if ((uint)output_node == 3) {
      uVar1 = get_constant_metadata<unsigned_int>(_num_ops,output_node._4_4_ + NodeIOFlags);
      in_RCX = (ulong)uVar1;
      __return_storage_ptr__->max_records = uVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

NodeOutputData Converter::Impl::get_node_output(llvm::MDNode *output)
{
	NodeOutputData data = {};

	uint32_t num_ops = output->getNumOperands();
	for (uint32_t i = 0; i < num_ops; i += 2)
	{
		auto tag = DXIL::NodeMetadataTag(get_constant_metadata(output, i));
		if (tag == DXIL::NodeMetadataTag::NodeOutputID)
		{
			auto *output_node = llvm::cast<llvm::MDNode>(output->getOperand(i + 1));
			data.node_id = get_string_metadata(output_node, 0);
			data.node_array_index = get_constant_metadata(output_node, 1);
		}
		else if (tag == DXIL::NodeMetadataTag::NodeAllowSparseNodes)
			data.sparse_array = get_constant_metadata(output, i + 1) != 0;
		else if (tag == DXIL::NodeMetadataTag::NodeOutputArraySize)
			data.node_array_size = get_constant_metadata(output, i + 1);
		else if (tag == DXIL::NodeMetadataTag::NodeMaxRecords)
			data.max_records = get_constant_metadata(output, i + 1);
	}

	return data;
}